

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sha1_hash.cpp
# Opt level: O2

void __thiscall
libtorrent::anon_unknown_5::bits_shift_left(anon_unknown_5 *this,span<unsigned_int> number,int n)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  
  iVar6 = (int)number.m_len;
  iVar10 = (int)number.m_ptr;
  iVar9 = (int)((long)iVar6 / 0x20);
  iVar2 = iVar10 - iVar9;
  if (iVar2 != 0 && iVar9 <= iVar10) {
    if (0x1f < iVar6) {
      uVar7 = (long)iVar6 / 0x20 & 0xffffffff;
      memmove(this,this + uVar7 * 4,(long)iVar2 * 4);
      memset(this + (long)iVar2 * 4,0,uVar7 << 2);
      iVar6 = iVar6 + iVar9 * -0x20;
    }
    if (0 < iVar6) {
      uVar3 = *(uint *)this;
      uVar4 = uVar3 >> 0x18 | (uVar3 & 0xff0000) >> 8 | (uVar3 & 0xff00) << 8 | uVar3 << 0x18;
      *(uint *)this = uVar4;
      uVar3 = iVar10 - 1;
      bVar1 = (byte)iVar6;
      uVar8 = 0;
      uVar7 = 0;
      if (0 < (int)uVar3) {
        uVar7 = (ulong)uVar3;
      }
      for (; uVar7 != uVar8; uVar8 = uVar8 + 1) {
        uVar5 = uVar4 << (bVar1 & 0x1f);
        uVar4 = *(uint *)(this + uVar8 * 4 + 4);
        uVar4 = uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
        *(uint *)(this + uVar8 * 4 + 4) = uVar4;
        uVar5 = uVar4 >> (0x20 - bVar1 & 0x1f) | uVar5;
        *(uint *)(this + uVar8 * 4) =
             uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
      }
      uVar4 = *(int *)(this + (long)(int)uVar3 * 4) << (bVar1 & 0x1f);
      *(uint *)(this + (long)(int)uVar3 * 4) =
           uVar4 >> 0x18 | (uVar4 & 0xff0000) >> 8 | (uVar4 & 0xff00) << 8 | uVar4 << 0x18;
    }
    return;
  }
  memset(this,0,(long)number.m_ptr << 2);
  return;
}

Assistant:

void bits_shift_left(span<std::uint32_t> const number, int n) noexcept
	{
		TORRENT_ASSERT(n >= 0);
		int const num_words = n / 32;
		int const number_size = int(number.size());
		if (num_words >= number_size)
		{
			std::memset(number.data(), 0, std::size_t(number.size() * 4));
			return;
		}

		if (num_words > 0)
		{
			std::memmove(number.data(), number.data() + num_words
				, std::size_t(number_size - num_words) * sizeof(std::uint32_t));
			std::memset(number.data() + (number_size - num_words)
				, 0, std::size_t(num_words) * sizeof(std::uint32_t));
			n -= num_words * 32;
		}
		if (n > 0)
		{
			// keep in mind that the uint32_t are stored in network
			// byte order, so they have to be byteswapped before
			// applying the shift operations, and then byteswapped
			// back again.
			number[0] = aux::network_to_host(number[0]);
			for (int i = 0; i < number_size - 1; ++i)
			{
				number[i] <<= n;
				number[i + 1] = aux::network_to_host(number[i + 1]);
				number[i] |= number[i + 1] >> (32 - n);
				number[i] = aux::host_to_network(number[i]);
			}
			number[number_size - 1] <<= n;
			number[number_size - 1] = aux::host_to_network(number[number_size - 1]);
		}
	}